

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void handleSelectionRequest(XEvent_conflict *event)

{
  undefined4 local_d8 [2];
  XEvent_conflict reply;
  XSelectionRequestEvent *request;
  XEvent_conflict *event_local;
  
  reply.pad[0x17] = (long)event;
  request = (XSelectionRequestEvent *)event;
  memset(local_d8,0,0xc0);
  local_d8[0] = 0x1f;
  reply.xselectionrequest.selection =
       writeTargetToProperty((XSelectionRequestEvent *)reply.pad[0x17]);
  reply.xerror.resourceid = *(XID *)(reply.pad[0x17] + 0x18);
  reply.xany.display = (Display *)*(undefined8 *)(reply.pad[0x17] + 0x28);
  reply.xany.window = *(Window *)(reply.pad[0x17] + 0x30);
  reply.xkey.root = *(Window *)(reply.pad[0x17] + 0x38);
  reply.xkey.time = *(Time *)(reply.pad[0x17] + 0x48);
  XSendEvent(_glfw.x11.display,*(undefined8 *)(reply.pad[0x17] + 0x28),0,0,local_d8);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}